

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O1

UniqueId * __thiscall COLLADASaxFWL::MeshLoader::getUniqueId(MeshLoader *this)

{
  int iVar1;
  undefined4 extraout_var;
  Mesh *pMVar2;
  
  if (this->mCurrentPrimitiveType - TRIANGLES < 8) {
    pMVar2 = (Mesh *)this->mCurrentMeshPrimitive;
  }
  else {
    pMVar2 = this->mMesh;
    if (pMVar2 == (Mesh *)0x0) {
      return (UniqueId *)COLLADAFW::UniqueId::INVALID;
    }
  }
  iVar1 = (*(pMVar2->super_Geometry).super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)359>.
            super_Object._vptr_Object[3])();
  return (UniqueId *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const COLLADAFW::UniqueId& MeshLoader::getUniqueId ()
    {
        switch ( mCurrentPrimitiveType )
        {
        case TRIANGLES:
        case LINES:
        case TRISTRIPS:
        case TRIFANS:
        case POLYGONS:
        case POLYGONS_HOLE:
		case POLYLIST: 
		case LINESTRIPS: 
            return mCurrentMeshPrimitive->getUniqueId (); break;
        default:
            if ( mMesh ) return mMesh->getUniqueId (); break;
        }

        return COLLADAFW::UniqueId::INVALID;
    }